

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_symbol(AMQP_VALUE value,char **symbol_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || symbol_value == (char **)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x4b8;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_symbol",0x4b7,1,"Bad arguments: value = %p, symbol_value = %p",value
                ,symbol_value);
    }
  }
  else if (value->type == AMQP_TYPE_SYMBOL) {
    *symbol_value = (char *)(value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x4c2;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_symbol",0x4c1,1,"Value is not of type SYMBOL");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_symbol(AMQP_VALUE value, const char** symbol_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_147: [If any of the arguments is NULL then amqpvalue_get_symbol shall return a non-zero value.] */
    if ((value == NULL) ||
        (symbol_value == NULL))
    {
        LogError("Bad arguments: value = %p, symbol_value = %p",
            value, symbol_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;

        /* Codes_SRS_AMQPVALUE_01_148: [If the type of the value is not symbol (was not created with amqpvalue_create_symbol), then amqpvalue_get_symbol shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_SYMBOL)
        {
            LogError("Value is not of type SYMBOL");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_145: [amqpvalue_get_symbol shall fill in the symbol_value the symbol value string held by the AMQP_VALUE.] */
            *symbol_value = value_data->value.symbol_value.chars;

            /* Codes_SRS_AMQPVALUE_01_146: [On success, amqpvalue_get_symbol shall return 0.] */
            result = 0;
        }
    }

    return result;
}